

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.h
# Opt level: O2

void __thiscall sptk::reaper::LpcAnalyzer::~LpcAnalyzer(LpcAnalyzer *this)

{
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->window_).super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)this);
  return;
}

Assistant:

~LpcAnalyzer(void) { }